

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::_::UnverifiedConfig> *
kj::_::populateUnverifiedConfig
          (Maybe<kj::_::UnverifiedConfig> *__return_storage_ptr__,Array<kj::_::KeyMaybeVal> *params)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 *puVar4;
  Maybe<kj::ArrayPtr<const_char>_> *pMVar5;
  long lVar6;
  bool *takeOverSetting;
  bool *pbVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined2 local_58;
  bool local_50 [8];
  undefined8 local_48;
  undefined8 uStack_40;
  bool local_38 [8];
  undefined8 local_30;
  undefined8 uStack_28;
  
  uVar1 = params->size_;
  if (4 < uVar1) {
    (__return_storage_ptr__->ptr).isSet = false;
    return __return_storage_ptr__;
  }
  local_58 = 0;
  local_50[0] = false;
  local_38[0] = false;
  if (uVar1 == 0) {
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = 0;
    (__return_storage_ptr__->ptr).field_1.value.clientMaxWindowBits.ptr.isSet = false;
  }
  else {
    pMVar5 = &params->ptr->val;
    lVar6 = uVar1 * 0x28;
    do {
      if (*(long *)((long)(pMVar5 + -1) + 0x10) == 0x16) {
        pcVar2 = *(char **)((long)(pMVar5 + -1) + 8);
        auVar11[0] = -(*pcVar2 == 'c');
        auVar11[1] = -(pcVar2[1] == 'l');
        auVar11[2] = -(pcVar2[2] == 'i');
        auVar11[3] = -(pcVar2[3] == 'e');
        auVar11[4] = -(pcVar2[4] == 'n');
        auVar11[5] = -(pcVar2[5] == 't');
        auVar11[6] = -(pcVar2[6] == '_');
        auVar11[7] = -(pcVar2[7] == 'm');
        auVar11[8] = -(pcVar2[8] == 'a');
        auVar11[9] = -(pcVar2[9] == 'x');
        auVar11[10] = -(pcVar2[10] == '_');
        auVar11[0xb] = -(pcVar2[0xb] == 'w');
        auVar11[0xc] = -(pcVar2[0xc] == 'i');
        auVar11[0xd] = -(pcVar2[0xd] == 'n');
        auVar11[0xe] = -(pcVar2[0xe] == 'd');
        auVar11[0xf] = -(pcVar2[0xf] == 'o');
        auVar15[0] = -(pcVar2[6] == '_');
        auVar15[1] = -(pcVar2[7] == 'm');
        auVar15[2] = -(pcVar2[8] == 'a');
        auVar15[3] = -(pcVar2[9] == 'x');
        auVar15[4] = -(pcVar2[10] == '_');
        auVar15[5] = -(pcVar2[0xb] == 'w');
        auVar15[6] = -(pcVar2[0xc] == 'i');
        auVar15[7] = -(pcVar2[0xd] == 'n');
        auVar15[8] = -(pcVar2[0xe] == 'd');
        auVar15[9] = -(pcVar2[0xf] == 'o');
        auVar15[10] = -(pcVar2[0x10] == 'w');
        auVar15[0xb] = -(pcVar2[0x11] == '_');
        auVar15[0xc] = -(pcVar2[0x12] == 'b');
        auVar15[0xd] = -(pcVar2[0x13] == 'i');
        auVar15[0xe] = -(pcVar2[0x14] == 't');
        auVar15[0xf] = -(pcVar2[0x15] == 's');
        auVar15 = auVar15 & auVar11;
        bVar8 = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff;
        pbVar7 = local_50;
        if (((bVar8) &&
            (auVar12[0] = -(*pcVar2 == 's'), auVar12[1] = -(pcVar2[1] == 'e'),
            auVar12[2] = -(pcVar2[2] == 'r'), auVar12[3] = -(pcVar2[3] == 'v'),
            auVar12[4] = -(pcVar2[4] == 'e'), auVar12[5] = -(pcVar2[5] == 'r'),
            auVar12[6] = -(pcVar2[6] == '_'), auVar12[7] = -(pcVar2[7] == 'm'),
            auVar12[8] = -(pcVar2[8] == 'a'), auVar12[9] = -(pcVar2[9] == 'x'),
            auVar12[10] = -(pcVar2[10] == '_'), auVar12[0xb] = -(pcVar2[0xb] == 'w'),
            auVar12[0xc] = -(pcVar2[0xc] == 'i'), auVar12[0xd] = -(pcVar2[0xd] == 'n'),
            auVar12[0xe] = -(pcVar2[0xe] == 'd'), auVar12[0xf] = -(pcVar2[0xf] == 'o'),
            auVar16[0] = -(pcVar2[6] == '_'), auVar16[1] = -(pcVar2[7] == 'm'),
            auVar16[2] = -(pcVar2[8] == 'a'), auVar16[3] = -(pcVar2[9] == 'x'),
            auVar16[4] = -(pcVar2[10] == '_'), auVar16[5] = -(pcVar2[0xb] == 'w'),
            auVar16[6] = -(pcVar2[0xc] == 'i'), auVar16[7] = -(pcVar2[0xd] == 'n'),
            auVar16[8] = -(pcVar2[0xe] == 'd'), auVar16[9] = -(pcVar2[0xf] == 'o'),
            auVar16[10] = -(pcVar2[0x10] == 'w'), auVar16[0xb] = -(pcVar2[0x11] == '_'),
            auVar16[0xc] = -(pcVar2[0x12] == 'b'), auVar16[0xd] = -(pcVar2[0x13] == 'i'),
            auVar16[0xe] = -(pcVar2[0x14] == 't'), auVar16[0xf] = -(pcVar2[0x15] == 's'),
            auVar16 = auVar16 & auVar12, pbVar7 = local_38,
            (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff)) || (*pbVar7 == true))
        goto LAB_003eabf7;
        if ((pMVar5->ptr).isSet != true) {
          puVar4 = &local_30;
          if (!bVar8) {
            puVar4 = &local_48;
          }
          *puVar4 = 0;
          puVar4[1] = 0;
          goto LAB_003eabc0;
        }
        if ((pMVar5->ptr).field_1.value.size_ == 0) goto LAB_003eabf7;
        if (pMVar5 != (Maybe<kj::ArrayPtr<const_char>_> *)pbVar7) {
          puVar4 = &local_30;
          if (!bVar8) {
            puVar4 = &local_48;
          }
          sVar3 = (pMVar5->ptr).field_1.value.size_;
          *puVar4 = (pMVar5->ptr).field_1.value.ptr;
          puVar4[1] = sVar3;
          goto LAB_003eabc0;
        }
      }
      else {
        if (*(long *)((long)(pMVar5 + -1) + 0x10) != 0x1a) {
LAB_003eabf7:
          (__return_storage_ptr__->ptr).isSet = false;
          return __return_storage_ptr__;
        }
        pcVar2 = *(char **)((long)(pMVar5 + -1) + 8);
        auVar9[0] = -(*pcVar2 == 'c');
        auVar9[1] = -(pcVar2[1] == 'l');
        auVar9[2] = -(pcVar2[2] == 'i');
        auVar9[3] = -(pcVar2[3] == 'e');
        auVar9[4] = -(pcVar2[4] == 'n');
        auVar9[5] = -(pcVar2[5] == 't');
        auVar9[6] = -(pcVar2[6] == '_');
        auVar9[7] = -(pcVar2[7] == 'n');
        auVar9[8] = -(pcVar2[8] == 'o');
        auVar9[9] = -(pcVar2[9] == '_');
        auVar9[10] = -(pcVar2[10] == 'c');
        auVar9[0xb] = -(pcVar2[0xb] == 'o');
        auVar9[0xc] = -(pcVar2[0xc] == 'n');
        auVar9[0xd] = -(pcVar2[0xd] == 't');
        auVar9[0xe] = -(pcVar2[0xe] == 'e');
        auVar9[0xf] = -(pcVar2[0xf] == 'x');
        auVar13[0] = -(pcVar2[10] == 'c');
        auVar13[1] = -(pcVar2[0xb] == 'o');
        auVar13[2] = -(pcVar2[0xc] == 'n');
        auVar13[3] = -(pcVar2[0xd] == 't');
        auVar13[4] = -(pcVar2[0xe] == 'e');
        auVar13[5] = -(pcVar2[0xf] == 'x');
        auVar13[6] = -(pcVar2[0x10] == 't');
        auVar13[7] = -(pcVar2[0x11] == '_');
        auVar13[8] = -(pcVar2[0x12] == 't');
        auVar13[9] = -(pcVar2[0x13] == 'a');
        auVar13[10] = -(pcVar2[0x14] == 'k');
        auVar13[0xb] = -(pcVar2[0x15] == 'e');
        auVar13[0xc] = -(pcVar2[0x16] == 'o');
        auVar13[0xd] = -(pcVar2[0x17] == 'v');
        auVar13[0xe] = -(pcVar2[0x18] == 'e');
        auVar13[0xf] = -(pcVar2[0x19] == 'r');
        auVar13 = auVar13 & auVar9;
        pbVar7 = (bool *)&local_58;
        if (((((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) &&
             (auVar10[0] = -(*pcVar2 == 's'), auVar10[1] = -(pcVar2[1] == 'e'),
             auVar10[2] = -(pcVar2[2] == 'r'), auVar10[3] = -(pcVar2[3] == 'v'),
             auVar10[4] = -(pcVar2[4] == 'e'), auVar10[5] = -(pcVar2[5] == 'r'),
             auVar10[6] = -(pcVar2[6] == '_'), auVar10[7] = -(pcVar2[7] == 'n'),
             auVar10[8] = -(pcVar2[8] == 'o'), auVar10[9] = -(pcVar2[9] == '_'),
             auVar10[10] = -(pcVar2[10] == 'c'), auVar10[0xb] = -(pcVar2[0xb] == 'o'),
             auVar10[0xc] = -(pcVar2[0xc] == 'n'), auVar10[0xd] = -(pcVar2[0xd] == 't'),
             auVar10[0xe] = -(pcVar2[0xe] == 'e'), auVar10[0xf] = -(pcVar2[0xf] == 'x'),
             auVar14[0] = -(pcVar2[10] == 'c'), auVar14[1] = -(pcVar2[0xb] == 'o'),
             auVar14[2] = -(pcVar2[0xc] == 'n'), auVar14[3] = -(pcVar2[0xd] == 't'),
             auVar14[4] = -(pcVar2[0xe] == 'e'), auVar14[5] = -(pcVar2[0xf] == 'x'),
             auVar14[6] = -(pcVar2[0x10] == 't'), auVar14[7] = -(pcVar2[0x11] == '_'),
             auVar14[8] = -(pcVar2[0x12] == 't'), auVar14[9] = -(pcVar2[0x13] == 'a'),
             auVar14[10] = -(pcVar2[0x14] == 'k'), auVar14[0xb] = -(pcVar2[0x15] == 'e'),
             auVar14[0xc] = -(pcVar2[0x16] == 'o'), auVar14[0xd] = -(pcVar2[0x17] == 'v'),
             auVar14[0xe] = -(pcVar2[0x18] == 'e'), auVar14[0xf] = -(pcVar2[0x19] == 'r'),
             auVar14 = auVar14 & auVar10, pbVar7 = (bool *)((long)&local_58 + 1),
             (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff)) || (*pbVar7 == true)) ||
           ((pMVar5->ptr).isSet == true)) goto LAB_003eabf7;
LAB_003eabc0:
        *pbVar7 = true;
      }
      pMVar5 = (Maybe<kj::ArrayPtr<const_char>_> *)((long)(pMVar5 + 1) + 0x10);
      lVar6 = lVar6 + -0x28;
    } while (lVar6 != 0);
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = local_58;
    (__return_storage_ptr__->ptr).field_1.value.clientMaxWindowBits.ptr.isSet = local_50[0];
    if ((local_50[0] & 1U) != 0) {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_48;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) = uStack_40;
    }
  }
  (__return_storage_ptr__->ptr).field_1.value.serverMaxWindowBits.ptr.isSet = local_38[0];
  if (local_38[0] == true) {
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_30;
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = uStack_28;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<UnverifiedConfig> populateUnverifiedConfig(kj::Array<KeyMaybeVal>& params) {
  // Given a collection of <key, MaybeValue> pairs, attempt to populate an `UnverifiedConfig` struct.
  // If the struct cannot be populated, we return null.
  //
  // This function populates the struct with what it finds, it does not perform bounds checking or
  // concern itself with valid `Value`s (so long as the `Value` is non-empty).
  //
  // The following issues would prevent a struct from being populated:
  //  Key issues:
  //    - `Key` is invalid (see `parseKeyName()`).
  //    - `Key` is repeated.
  //  Value issues:
  //    - Got a `Value` when none was expected (only the `max_window_bits` parameters expect values).
  //    - Got an empty `Value` (0 characters, or all whitespace characters).

  if (params.size() > 4) {
    // We expect 4 `Key`s at most, having more implies repeats/invalid keys are present.
    return kj::none;
  }

  UnverifiedConfig config;

  for (auto& param : params) {
    KJ_IF_SOME(paramType, parseKeyName(param.key)) {
      // `Key` is valid, but we still want to check for repeats.
      const auto& side = paramType.side;
      const auto& property = paramType.property;

      if (property == ParamType::NO_CONTEXT_TAKEOVER) {
        auto& takeOverSetting = (side == ParamType::CLIENT) ?
            config.clientNoContextTakeover : config.serverNoContextTakeover;

        if (takeOverSetting == true) {
          // This `Key` is a repeat; invalid config.
          return kj::none;
        }

        if (param.val != kj::none) {
          // The `x_no_context_takeover` parameter shouldn't have a value; invalid config.
          return kj::none;
        }

        takeOverSetting = true;
      } else if (property == ParamType::MAX_WINDOW_BITS) {
        auto& maxBitsSetting =
            (side == ParamType::CLIENT) ? config.clientMaxWindowBits : config.serverMaxWindowBits;

        if (maxBitsSetting != kj::none) {
          // This `Key` is a repeat; invalid config.
          return kj::none;
        }

        KJ_IF_SOME(value, param.val) {
          if (value.size() == 0) {
            // This is equivalent to `x_max_window_bits=`, since we got an "=" we expected a token
            // to follow.
            return kj::none;
          }
          maxBitsSetting = param.val;
        } else {
          // We know we got this `max_window_bits` parameter in a Request/Response, and we also know
          // that it didn't include an "=" (otherwise the value wouldn't be null).
          // It's important to retain the information that the parameter was received *without* a
          // corresponding value, as this may determine whether the offer is valid or not.
          //
          // To retain this information, we'll set `maxBitsSetting` to be an empty ArrayPtr so this
          // can be dealt with properly later.
          maxBitsSetting = ArrayPtr<const char>();
        }
      }
    } else {
      // Invalid parameter.
      return kj::none;
    }
  }